

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ray.cpp
# Opt level: O2

string * __thiscall
pbrt::RayDifferential::ToString_abi_cxx11_(string *__return_storage_ptr__,RayDifferential *this)

{
  Vector3<float> *in_stack_ffffffffffffffe8;
  char *local_10;
  
  local_10 = "false";
  if (this->hasDifferentials != false) {
    local_10 = "true";
  }
  StringPrintf<pbrt::Ray_const&,char_const*,pbrt::Point3<float>const&,pbrt::Vector3<float>const&,pbrt::Point3<float>const&,pbrt::Vector3<float>const&>
            (__return_storage_ptr__,
             (pbrt *)"[ ray: %s differentials: %s xo: %s xd: %s yo: %s yd: %s ]",(char *)this,
             (Ray *)&local_10,(char **)&this->rxOrigin,(Point3<float> *)&this->rxDirection,
             (Vector3<float> *)&this->ryOrigin,(Point3<float> *)&this->ryDirection,
             in_stack_ffffffffffffffe8);
  return __return_storage_ptr__;
}

Assistant:

std::string RayDifferential::ToString() const {
    return StringPrintf("[ ray: %s differentials: %s xo: %s xd: %s yo: %s yd: %s ]",
                        ((const Ray &)(*this)), hasDifferentials ? "true" : "false",
                        rxOrigin, rxDirection, ryOrigin, ryDirection);
}